

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O2

void ARGBCopyAlphaRow_C(uint8_t *src,uint8_t *dst,int width)

{
  long lVar1;
  
  for (lVar1 = 0; (int)lVar1 < width + -1; lVar1 = lVar1 + 2) {
    dst[lVar1 * 4 + 3] = src[lVar1 * 4 + 3];
    dst[lVar1 * 4 + 7] = src[lVar1 * 4 + 7];
  }
  if ((width & 1U) != 0) {
    dst[lVar1 * 4 + 3] = src[lVar1 * 4 + 3];
  }
  return;
}

Assistant:

void ARGBCopyAlphaRow_C(const uint8_t* src, uint8_t* dst, int width) {
  int i;
  for (i = 0; i < width - 1; i += 2) {
    dst[3] = src[3];
    dst[7] = src[7];
    dst += 8;
    src += 8;
  }
  if (width & 1) {
    dst[3] = src[3];
  }
}